

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptelement.cpp
# Opt level: O2

void __thiscall
ScriptElement_OpNumTypeConstructor_Test::ScriptElement_OpNumTypeConstructor_Test
          (ScriptElement_OpNumTypeConstructor_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_005c3f90;
  return;
}

Assistant:

TEST(ScriptElement, OpNumTypeConstructor) {
  ScriptElement op_elem = ScriptElement(ScriptOperator::OP_12);

  EXPECT_EQ(ScriptElementType::kElementOpCode, op_elem.GetType());
  EXPECT_EQ(ScriptOperator::OP_12, op_elem.GetOpCode());
  EXPECT_EQ(ByteData().GetBytes(), op_elem.GetBinaryData().GetBytes());
  EXPECT_EQ(12, op_elem.GetNumber());
  EXPECT_EQ(ByteData("5c").GetBytes(), op_elem.GetData().GetBytes());
  EXPECT_STREQ("12", op_elem.ToString().c_str());
  EXPECT_FALSE(op_elem.IsBinary());
  EXPECT_TRUE(op_elem.IsNumber());
  EXPECT_TRUE(op_elem.IsOpCode());
}